

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O2

matrix<double> *
mat_lib::operator-(matrix<double> *__return_storage_ptr__,matrix<double> *a,matrix<double> *b)

{
  matrix<double> *m;
  ostream *poVar1;
  invalid_argument *this;
  string asStack_1b8 [32];
  matrix<double> c;
  
  if ((a->rows__ == b->rows__) && (a->columns__ == b->columns__)) {
    matrix<double>::matrix(&c,a);
    m = matrix<double>::operator-=(&c,b);
    matrix<double>::matrix(__return_storage_ptr__,m);
    matrix<double>::~matrix(&c);
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&c);
  poVar1 = std::operator<<((ostream *)&c,"size mismatch! cannot substract matrices (");
  poVar1 = std::operator<<(poVar1,"operator-");
  poVar1 = std::operator<<(poVar1,"() in ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/miguel-kjh[P]MatLibraryPy/matrix.hpp"
                          );
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x222);
  std::operator<<(poVar1,")");
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this,asStack_1b8);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

size_t rows() const { return rows__; }